

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

faidx_t * fai_load(char *fn)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  BGZF *pBVar3;
  faidx_t *fai;
  FILE *fp;
  char *str;
  char *fn_local;
  
  sVar2 = strlen(fn);
  __s = (char *)calloc(sVar2 + 5,1);
  sprintf(__s,"%s.fai",fn);
  iVar1 = hisremote(__s);
  if (iVar1 == 0) {
    fai = (faidx_t *)fopen(__s,"rb");
  }
  else {
    fai = (faidx_t *)download_and_open(__s);
    if ((FILE *)fai == (FILE *)0x0) {
      fprintf(_stderr,"[fai_load] failed to open remote FASTA index %s\n",__s);
      free(__s);
      return (faidx_t *)0x0;
    }
  }
  if (fai == (faidx_t *)0x0) {
    fprintf(_stderr,"[fai_load] build FASTA index.\n");
    fai_build(fn);
    fai = (faidx_t *)fopen(__s,"rb");
    if ((FILE *)fai == (FILE *)0x0) {
      fprintf(_stderr,"[fai_load] fail to open FASTA index.\n");
      free(__s);
      return (faidx_t *)0x0;
    }
  }
  fn_local = (char *)fai_read((FILE *)fai);
  fclose((FILE *)fai);
  pBVar3 = bgzf_open(fn,"rb");
  ((faidx_t *)fn_local)->bgzf = pBVar3;
  free(__s);
  if (((faidx_t *)fn_local)->bgzf == (BGZF *)0x0) {
    fprintf(_stderr,"[fai_load] fail to open FASTA file.\n");
    fn_local = (char *)0x0;
  }
  else if (((*(int *)((faidx_t *)fn_local)->bgzf << 1) >> 0x1e == 1) &&
          (iVar1 = bgzf_index_load(((faidx_t *)fn_local)->bgzf,fn,".gzi"), iVar1 < 0)) {
    fprintf(_stderr,"[fai_load] failed to load .gzi index: %s[.gzi]\n",fn);
    fai_destroy((faidx_t *)fn_local);
    fn_local = (char *)0x0;
  }
  return (faidx_t *)fn_local;
}

Assistant:

faidx_t *fai_load(const char *fn)
{
    char *str;
    FILE *fp;
    faidx_t *fai;
    str = (char*)calloc(strlen(fn) + 5, 1);
    sprintf(str, "%s.fai", fn);

    if (hisremote(str))
    {
        fp = download_and_open(str);
        if ( !fp )
        {
            fprintf(stderr, "[fai_load] failed to open remote FASTA index %s\n", str);
            free(str);
            return 0;
        }
    }
    else
        fp = fopen(str, "rb");

    if (fp == 0) {
        fprintf(stderr, "[fai_load] build FASTA index.\n");
        fai_build(fn);
        fp = fopen(str, "rb");
        if (fp == 0) {
            fprintf(stderr, "[fai_load] fail to open FASTA index.\n");
            free(str);
            return 0;
        }
    }

    fai = fai_read(fp);
    fclose(fp);

    fai->bgzf = bgzf_open(fn, "rb");
    free(str);
    if (fai->bgzf == 0) {
        fprintf(stderr, "[fai_load] fail to open FASTA file.\n");
        return 0;
    }
    if ( fai->bgzf->is_compressed==1 )
    {
        if ( bgzf_index_load(fai->bgzf, fn, ".gzi") < 0 )
        {
            fprintf(stderr, "[fai_load] failed to load .gzi index: %s[.gzi]\n", fn);
            fai_destroy(fai);
            return NULL;
        }
    }
    return fai;
}